

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-test.h
# Opt level: O2

ParamGenerator<(anonymous_namespace)::CcsTestCase> __thiscall
testing::
ValuesIn<std::vector<(anonymous_namespace)::CcsTestCase,std::allocator<(anonymous_namespace)::CcsTestCase>>>
          (testing *this,
          vector<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>
          *container)

{
  pointer pCVar1;
  undefined8 *puVar2;
  _Vector_base<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>
  *this_00;
  pointer this_01;
  undefined8 *puVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar4;
  pointer pCVar5;
  ParamGenerator<(anonymous_namespace)::CcsTestCase> PVar6;
  
  pCVar5 = (container->
           super__Vector_base<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (container->
           super__Vector_base<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (undefined8 *)operator_new(0x20);
  *puVar2 = &PTR__ValuesInIteratorRangeGenerator_00195c68;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[3] = 0;
  lVar4 = (long)pCVar1 - (long)pCVar5;
  this_00 = (_Vector_base<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>
             *)(lVar4 / 0x58);
  if (this_00 < (_Vector_base<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>
                 *)0x1745d1745d1745e) {
    this_01 = std::
              _Vector_base<(anonymous_namespace)::CcsTestCase,_std::allocator<(anonymous_namespace)::CcsTestCase>_>
              ::_M_allocate(this_00,(size_t)container);
    puVar2[1] = this_01;
    puVar2[3] = lVar4 + (long)this_01;
    for (; pCVar5 != pCVar1; pCVar5 = pCVar5 + 1) {
      anon_unknown.dwarf_d1b8::CcsTestCase::CcsTestCase(this_01,pCVar5);
      this_01 = this_01 + 1;
    }
    puVar2[2] = this_01;
    *(undefined8 **)this = puVar2;
    *(undefined8 *)(this + 8) = 0;
    puVar3 = (undefined8 *)operator_new(0x18);
    puVar3[1] = 0x100000001;
    *puVar3 = &PTR___Sp_counted_base_00195d30;
    puVar3[2] = puVar2;
    *(undefined8 **)(this + 8) = puVar3;
    PVar6.impl_.
    super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::CcsTestCase>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = extraout_RDX._M_pi;
    PVar6.impl_.
    super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::CcsTestCase>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)this;
    return (ParamGenerator<(anonymous_namespace)::CcsTestCase>)
           PVar6.impl_.
           super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::CcsTestCase>,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  std::__throw_length_error("cannot create std::vector larger than max_size()");
}

Assistant:

internal::ParamGenerator<typename Container::value_type> ValuesIn(
    const Container& container) {
  return ValuesIn(container.begin(), container.end());
}